

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_snapshots.cpp
# Opt level: O0

bool writeError(path *fname,FILE **fileToClose)

{
  char *badValueMessage;
  string local_38;
  FILE **local_18;
  FILE **fileToClose_local;
  path *fname_local;
  
  local_18 = fileToClose;
  fileToClose_local = (FILE **)fname;
  std::filesystem::__cxx11::path::string(&local_38,fname);
  badValueMessage = (char *)std::__cxx11::string::c_str();
  Error("Write error (disk full?)",badValueMessage,IF_FIRST);
  std::__cxx11::string::~string((string *)&local_38);
  fclose((FILE *)*local_18);
  return false;
}

Assistant:

static bool writeError(const std::filesystem::path & fname, FILE* & fileToClose) {
	Error("Write error (disk full?)", fname.string().c_str(), IF_FIRST);
	fclose(fileToClose);
	return false;
}